

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O2

void test_callbacks_after_response_sent(void)

{
  byte bVar1;
  int status_code;
  char *request;
  uint j;
  cio_error cVar2;
  cio_inet_address *arg1;
  long lVar3;
  long lVar4;
  undefined **ppuVar5;
  request_test *prVar6;
  int iVar7;
  byte bVar8;
  _func_cio_error_cio_buffered_stream_ptr_cio_read_buffer_ptr_char_ptr_cio_buffered_stream_read_handler_t_void_ptr
  *bs_read_until_fakes [4];
  cio_http_location target;
  request_test callbacks;
  cio_http_server_configuration config;
  cio_http_server server;
  
  bVar8 = 0;
  lVar3 = 0;
  do {
    if (lVar3 == 0xe) {
      free(&client_socket[-2].impl.close_timer.impl.ev.fd);
      return;
    }
    request = (&PTR_anon_var_dwarf_3e49_00118e00)[lVar3 * 3];
    iVar7 = (&DAT_00118e08)[lVar3 * 6];
    status_code = (&DAT_00118e0c)[lVar3 * 6];
    bVar1 = (&DAT_00118e10)[lVar3 * 0x18];
    ppuVar5 = &PTR_on_schema_00118f50;
    prVar6 = &callbacks;
    for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
      prVar6->on_scheme = (cio_http_data_cb_t)*ppuVar5;
      ppuVar5 = ppuVar5 + (ulong)bVar8 * -2 + 1;
      prVar6 = (request_test *)((long)prVar6 + (ulong)bVar8 * -0x10 + 8);
    }
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      bs_read_until_fakes[lVar4] = bs_read_until_ok;
    }
    bs_read_until_fakes[3] = bs_read_until_blocks;
    if ((bVar1 & 1) != 0) {
      cio_buffered_stream_read_until_fake.custom_fake =
           (_func_cio_error_cio_buffered_stream_ptr_cio_read_buffer_ptr_char_ptr_cio_buffered_stream_read_handler_t_void_ptr
            *)0x0;
      cio_buffered_stream_read_until_fake.custom_fake_seq = bs_read_until_fakes;
      cio_buffered_stream_read_until_fake.custom_fake_seq_len = 4;
    }
    iVar7 = iVar7 + -1;
    switch(iVar7) {
    case 0:
      on_schema_fake.custom_fake = data_callback_write_response;
      break;
    case 1:
      on_host_fake.custom_fake = data_callback_write_response;
      break;
    case 2:
      on_port_fake.custom_fake = data_callback_write_response;
      break;
    case 3:
      on_path_fake.custom_fake = data_callback_write_response;
      break;
    case 4:
      on_query_fake.custom_fake = data_callback_write_response;
      break;
    case 5:
      on_fragment_fake.custom_fake = data_callback_write_response;
      break;
    case 6:
      on_url_fake.custom_fake = data_callback_write_response;
      break;
    case 7:
      on_header_field_fake.custom_fake = data_callback_write_response;
      break;
    case 8:
      on_header_value_fake.custom_fake = data_callback_write_response;
      break;
    case 9:
      on_header_complete_fake.custom_fake = callback_write_ok_response;
      break;
    case 10:
      on_body_fake.custom_fake = data_callback_write_response;
      break;
    case 0xb:
      on_message_complete_fake.custom_fake = callback_write_not_found_response;
    }
    memcpy(&config,&DAT_001199e0,0xb8);
    arg1 = cio_get_inet_address_any4();
    cio_init_inet_socket_address(&config.endpoint,arg1,0x1f90);
    cVar2 = cio_http_server_init(&server,&loop,&config);
    UnityAssertEqualNumber
              (0,(long)cVar2,"Server initialization failed!",0x54b,UNITY_DISPLAY_STYLE_INT);
    cVar2 = cio_http_location_init(&target,"/foo",&callbacks,alloc_handler_for_callback_test);
    UnityAssertEqualNumber
              (0,(long)cVar2,"Request target initialization failed!",0x54f,UNITY_DISPLAY_STYLE_INT);
    cVar2 = cio_http_server_register_location(&server,&target);
    UnityAssertEqualNumber
              (0,(long)cVar2,"Register request target failed!",0x551,UNITY_DISPLAY_STYLE_INT);
    split_request(request);
    cVar2 = cio_http_server_serve(&server);
    UnityAssertEqualNumber(0,(long)cVar2,"Serving http failed!",0x556,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((ulong)(status_code == 500),(ulong)serve_error_fake.call_count,
               "Serve error callback was called!",0x557,UNITY_DISPLAY_STYLE_INT);
    check_http_response(status_code);
    switch(iVar7) {
    case 0xb:
      UnityAssertEqualNumber
                (1,(ulong)on_message_complete_fake.call_count,"on_message_complete was not called!",
                 0x55d,UNITY_DISPLAY_STYLE_INT);
    case 10:
      UnityAssertGreaterOrLessOrEqualNumber
                (0,(ulong)on_body_fake.call_count,UNITY_GREATER_THAN,"on_body was not called!",0x560
                 ,UNITY_DISPLAY_STYLE_INT);
    case 9:
      UnityAssertEqualNumber
                (1,(ulong)on_header_complete_fake.call_count,"on_header_complete was not called!",
                 0x563,UNITY_DISPLAY_STYLE_INT);
    case 8:
      UnityAssertEqualNumber
                (1,(ulong)on_header_value_fake.call_count,"on_header_value was not called!",0x566,
                 UNITY_DISPLAY_STYLE_INT);
    case 7:
      UnityAssertEqualNumber
                (1,(ulong)on_header_field_fake.call_count,"on_header_field was not called!",0x569,
                 UNITY_DISPLAY_STYLE_INT);
    case 6:
      UnityAssertEqualNumber
                (1,(ulong)on_url_fake.call_count,"on_url was not called!",0x56c,
                 UNITY_DISPLAY_STYLE_INT);
    case 5:
      UnityAssertEqualNumber
                (1,(ulong)on_fragment_fake.call_count,"on_fragment was not called!",0x56f,
                 UNITY_DISPLAY_STYLE_INT);
    case 4:
      UnityAssertEqualNumber
                (1,(ulong)on_query_fake.call_count,"on_query was not called!",0x572,
                 UNITY_DISPLAY_STYLE_INT);
    case 3:
      UnityAssertEqualNumber
                (1,(ulong)on_path_fake.call_count,"on_path was not called!",0x575,
                 UNITY_DISPLAY_STYLE_INT);
    case 2:
      UnityAssertEqualNumber
                (1,(ulong)on_port_fake.call_count,"on_port was not called!",0x578,
                 UNITY_DISPLAY_STYLE_INT);
    case 1:
      UnityAssertEqualNumber
                (1,(ulong)on_host_fake.call_count,"on_host was not called!",0x57b,
                 UNITY_DISPLAY_STYLE_INT);
    case 0:
      UnityAssertEqualNumber
                (1,(ulong)on_schema_fake.call_count,"on_schema was not called!",0x57e,
                 UNITY_DISPLAY_STYLE_INT);
    }
    switch(iVar7) {
    case 0:
      UnityAssertEqualNumber
                (0,(ulong)on_host_fake.call_count,"on_host was called!",0x587,
                 UNITY_DISPLAY_STYLE_INT);
    case 1:
      UnityAssertEqualNumber
                (0,(ulong)on_port_fake.call_count,"on_port was called!",0x58a,
                 UNITY_DISPLAY_STYLE_INT);
    case 2:
      UnityAssertEqualNumber
                (0,(ulong)on_path_fake.call_count,"on_path was called!",0x58d,
                 UNITY_DISPLAY_STYLE_INT);
    case 3:
      UnityAssertEqualNumber
                (0,(ulong)on_query_fake.call_count,"on_query was called!",0x590,
                 UNITY_DISPLAY_STYLE_INT);
    case 4:
      UnityAssertEqualNumber
                (0,(ulong)on_fragment_fake.call_count,"on_fragment was called!",0x593,
                 UNITY_DISPLAY_STYLE_INT);
    case 5:
      UnityAssertEqualNumber
                (0,(ulong)on_url_fake.call_count,"on_url was called!",0x596,UNITY_DISPLAY_STYLE_INT)
      ;
    case 6:
      UnityAssertEqualNumber
                (0,(ulong)on_header_field_fake.call_count,"on_header_field was called!",0x599,
                 UNITY_DISPLAY_STYLE_INT);
    case 7:
      UnityAssertEqualNumber
                (0,(ulong)on_header_value_fake.call_count,"on_header_value was called!",0x59c,
                 UNITY_DISPLAY_STYLE_INT);
    case 8:
      UnityAssertEqualNumber
                (0,(ulong)on_header_complete_fake.call_count,"on_header_complete was called!",0x59f,
                 UNITY_DISPLAY_STYLE_INT);
    case 9:
      UnityAssertEqualNumber
                (0,(ulong)on_body_fake.call_count,"on_body was called!",0x5a2,
                 UNITY_DISPLAY_STYLE_INT);
    case 10:
      UnityAssertEqualNumber
                (0,(ulong)on_message_complete_fake.call_count,"on_message_complete was called!",
                 0x5a5,UNITY_DISPLAY_STYLE_INT);
    default:
      if ((bVar1 & 1) != 0) {
        (*(code *)client_socket[1].impl.loop)
                  (&client_socket[1].impl.close_timer.impl.loop,
                   *(undefined8 *)&client_socket[1].impl.peer_closed_connection,0);
      }
      setUp();
      lVar3 = lVar3 + 1;
    }
  } while( true );
}

Assistant:

static void test_callbacks_after_response_sent(void)
{
	enum callback_sends_response {
		NO_RESPONSE = 0,
		ON_SCHEMA_SENDS_RESPONSE,
		ON_HOST_SENDS_RESPONSE,
		ON_PORT_SENDS_RESPONSE,
		ON_PATH_SENDS_RESPONSE,
		ON_QUERY_SENDS_RESPONSE,
		ON_FRAGMENT_SENDS_RESPONSE,
		ON_URL_SENDS_RESPONSE,
		ON_HEADER_FIELD_SENDS_RESPONSE,
		ON_HEADER_VALUE_SENDS_RESPONSE,
		ON_HEADER_COMPLETE_SENDS_RESPONSE,
		ON_BODY_SENDS_RESPONSE,
		ON_MESSAGE_COMPLETE_SENDS_RESPONSE
	};

	struct tests {
		const char *request;
		enum callback_sends_response who_sends_response;
		int expected_response;
		bool keep_alive;
	};
	struct tests tests[] = {
	    {.expected_response = 500, .who_sends_response = NO_RESPONSE, .request = "GET http://172.19.1.1:8080/foo?search=qry#fraggy" CRLF "Content-Length: 7" CRLF CRLF, .keep_alive = false},
	    {.expected_response = 404, .who_sends_response = ON_SCHEMA_SENDS_RESPONSE, .request = "GET http://172.19.1.1:8080/foo?search=qry#fraggy" CRLF "Content-Length: 5" CRLF CRLF, .keep_alive = false},
	    {.expected_response = 404, .who_sends_response = ON_HOST_SENDS_RESPONSE, .request = "GET http://172.19.1.1:8080/foo?search=qry#fraggy" CRLF "Content-Length: 5" CRLF CRLF, .keep_alive = false},
	    {.expected_response = 404, .who_sends_response = ON_PORT_SENDS_RESPONSE, .request = "GET http://172.19.1.1:8080/foo?search=qry#fraggy" CRLF "Content-Length: 5" CRLF CRLF, .keep_alive = false},
	    {.expected_response = 404, .who_sends_response = ON_PATH_SENDS_RESPONSE, .request = "GET http://172.19.1.1:8080/foo?search=qry#fraggy" CRLF "Content-Length: 5" CRLF CRLF, .keep_alive = false},
	    {.expected_response = 404, .who_sends_response = ON_QUERY_SENDS_RESPONSE, .request = "GET http://172.19.1.1:8080/foo?search=qry#fraggy" CRLF "Content-Length: 5" CRLF CRLF, .keep_alive = false},
	    {.expected_response = 404, .who_sends_response = ON_FRAGMENT_SENDS_RESPONSE, .request = "GET http://172.19.1.1:8080/foo?search=qry#fraggy" CRLF "Content-Length: 5" CRLF CRLF, .keep_alive = false},
	    {.expected_response = 404, .who_sends_response = ON_URL_SENDS_RESPONSE, .request = "GET http://172.19.1.1:8080/foo?search=qry#fraggy" CRLF "Content-Length: 5" CRLF CRLF, .keep_alive = false},
	    {.expected_response = 404, .who_sends_response = ON_HEADER_FIELD_SENDS_RESPONSE, .request = "GET http://172.19.1.1:8080/foo?search=qry#fraggy" CRLF "Content-Length: 5" CRLF CRLF, .keep_alive = false},
	    {.expected_response = 404, .who_sends_response = ON_HEADER_VALUE_SENDS_RESPONSE, .request = "GET http://172.19.1.1:8080/foo?search=qry#fraggy" CRLF "Content-Length: 5" CRLF CRLF, .keep_alive = false},
	    {.expected_response = 404, .who_sends_response = ON_BODY_SENDS_RESPONSE, .request = "GET http://172.19.1.1:8080/foo?search=qry#fraggy" CRLF "Content-Length: 5" CRLF CRLF "Hello", .keep_alive = false},
	    {.expected_response = 200, .who_sends_response = ON_HEADER_COMPLETE_SENDS_RESPONSE, .request = "GET http://172.19.1.1:8080/foo?search=qry#fraggy" CRLF "Content-Length: 5" CRLF CRLF, .keep_alive = false},
	    {.expected_response = 404, .who_sends_response = ON_MESSAGE_COMPLETE_SENDS_RESPONSE, .request = "GET http://172.19.1.1:8080/foo?search=qry#fraggy" CRLF "Content-Length: 5" CRLF CRLF, .keep_alive = false},
	    {.expected_response = 200, .who_sends_response = ON_HEADER_COMPLETE_SENDS_RESPONSE, .request = "GET http://172.19.1.1:8080/foo?search=qry#fraggy HTTP/1.1" CRLF "Content-Length: 5" CRLF CRLF, .keep_alive = true},
	};

	for (unsigned int i = 0; i < ARRAY_SIZE(tests); i++) {
		struct tests test = tests[i];

		struct request_test callbacks = {
		    .on_scheme = on_schema,
		    .on_host = on_host,
		    .on_port = on_port,
		    .on_path = on_path,
		    .on_query = on_query,
		    .on_fragment = on_fragment,
		    .on_url = on_url,
		    .on_header_field_name = on_header_field,
		    .on_header_field_value = on_header_value,
		    .on_header_complete = on_header_complete,
		    .on_body = on_body,
		    .on_message_complete = on_message_complete,
		};

		enum cio_error (*bs_read_until_fakes[4])(struct cio_buffered_stream *, struct cio_read_buffer *, const char *, cio_buffered_stream_read_handler_t, void *);
		size_t array_size = ARRAY_SIZE(bs_read_until_fakes);
		for (unsigned int j = 0; j < array_size - 1; j++) {
			bs_read_until_fakes[j] = bs_read_until_ok;
		}
		bs_read_until_fakes[array_size - 1] = bs_read_until_blocks;
		if (test.keep_alive) {
			cio_buffered_stream_read_until_fake.custom_fake = NULL;
			SET_CUSTOM_FAKE_SEQ(cio_buffered_stream_read_until, bs_read_until_fakes, (int)array_size)
		}

		if (test.who_sends_response == ON_SCHEMA_SENDS_RESPONSE)
			on_schema_fake.custom_fake = data_callback_write_response;
		if (test.who_sends_response == ON_HOST_SENDS_RESPONSE)
			on_host_fake.custom_fake = data_callback_write_response;
		if (test.who_sends_response == ON_PORT_SENDS_RESPONSE)
			on_port_fake.custom_fake = data_callback_write_response;
		if (test.who_sends_response == ON_PATH_SENDS_RESPONSE)
			on_path_fake.custom_fake = data_callback_write_response;
		if (test.who_sends_response == ON_QUERY_SENDS_RESPONSE)
			on_query_fake.custom_fake = data_callback_write_response;
		if (test.who_sends_response == ON_FRAGMENT_SENDS_RESPONSE)
			on_fragment_fake.custom_fake = data_callback_write_response;
		if (test.who_sends_response == ON_URL_SENDS_RESPONSE)
			on_url_fake.custom_fake = data_callback_write_response;
		if (test.who_sends_response == ON_HEADER_FIELD_SENDS_RESPONSE)
			on_header_field_fake.custom_fake = data_callback_write_response;
		if (test.who_sends_response == ON_HEADER_VALUE_SENDS_RESPONSE)
			on_header_value_fake.custom_fake = data_callback_write_response;
		if (test.who_sends_response == ON_BODY_SENDS_RESPONSE)
			on_body_fake.custom_fake = data_callback_write_response;
		if (test.who_sends_response == ON_HEADER_COMPLETE_SENDS_RESPONSE)
			on_header_complete_fake.custom_fake = callback_write_ok_response;
		if (test.who_sends_response == ON_MESSAGE_COMPLETE_SENDS_RESPONSE)
			on_message_complete_fake.custom_fake = callback_write_not_found_response;

		struct cio_http_server_configuration config = {
		    .on_error = serve_error,
		    .read_header_timeout_ns = header_read_timeout,
		    .read_body_timeout_ns = body_read_timeout,
		    .response_timeout_ns = response_timeout,
		    .close_timeout_ns = 10,
		    .alloc_client = alloc_dummy_client,
		    .free_client = free_dummy_client};

		cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

		struct cio_http_server server;
		enum cio_error err = cio_http_server_init(&server, &loop, &config);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");

		struct cio_http_location target;
		err = cio_http_location_init(&target, "/foo", &callbacks, alloc_handler_for_callback_test);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Request target initialization failed!");
		err = cio_http_server_register_location(&server, &target);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Register request target failed!");

		split_request(test.request);

		err = cio_http_server_serve(&server);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Serving http failed!");
		TEST_ASSERT_EQUAL_MESSAGE(test.expected_response == 500 ? 1 : 0, serve_error_fake.call_count, "Serve error callback was called!");

		check_http_response(test.expected_response);

		switch (test.who_sends_response) {
		case ON_MESSAGE_COMPLETE_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(1, on_message_complete_fake.call_count, "on_message_complete was not called!");
			/* FALLTHRU */
		case ON_BODY_SENDS_RESPONSE:
			TEST_ASSERT_GREATER_THAN_MESSAGE(0, on_body_fake.call_count, "on_body was not called!");
			/* FALLTHRU */
		case ON_HEADER_COMPLETE_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(1, on_header_complete_fake.call_count, "on_header_complete was not called!");
			/* FALLTHRU */
		case ON_HEADER_VALUE_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(1, on_header_value_fake.call_count, "on_header_value was not called!");
			/* FALLTHRU */
		case ON_HEADER_FIELD_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(1, on_header_field_fake.call_count, "on_header_field was not called!");
			/* FALLTHRU */
		case ON_URL_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(1, on_url_fake.call_count, "on_url was not called!");
			/* FALLTHRU */
		case ON_FRAGMENT_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(1, on_fragment_fake.call_count, "on_fragment was not called!");
			/* FALLTHRU */
		case ON_QUERY_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(1, on_query_fake.call_count, "on_query was not called!");
			/* FALLTHRU */
		case ON_PATH_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(1, on_path_fake.call_count, "on_path was not called!");
			/* FALLTHRU */
		case ON_PORT_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(1, on_port_fake.call_count, "on_port was not called!");
			/* FALLTHRU */
		case ON_HOST_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(1, on_host_fake.call_count, "on_host was not called!");
			/* FALLTHRU */
		case ON_SCHEMA_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(1, on_schema_fake.call_count, "on_schema was not called!");
			break;

		default:
			break;
		}

		switch (test.who_sends_response) {
		case ON_SCHEMA_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(0, on_host_fake.call_count, "on_host was called!");
			/* FALLTHRU */
		case ON_HOST_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(0, on_port_fake.call_count, "on_port was called!");
			/* FALLTHRU */
		case ON_PORT_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(0, on_path_fake.call_count, "on_path was called!");
			/* FALLTHRU */
		case ON_PATH_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(0, on_query_fake.call_count, "on_query was called!");
			/* FALLTHRU */
		case ON_QUERY_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(0, on_fragment_fake.call_count, "on_fragment was called!");
			/* FALLTHRU */
		case ON_FRAGMENT_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(0, on_url_fake.call_count, "on_url was called!");
			/* FALLTHRU */
		case ON_URL_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(0, on_header_field_fake.call_count, "on_header_field was called!");
			/* FALLTHRU */
		case ON_HEADER_FIELD_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(0, on_header_value_fake.call_count, "on_header_value was called!");
			/* FALLTHRU */
		case ON_HEADER_VALUE_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(0, on_header_complete_fake.call_count, "on_header_complete was called!");
			/* FALLTHRU */
		case ON_HEADER_COMPLETE_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(0, on_body_fake.call_count, "on_body was called!");
			/* FALLTHRU */
		case ON_BODY_SENDS_RESPONSE:
			TEST_ASSERT_EQUAL_MESSAGE(0, on_message_complete_fake.call_count, "on_message_complete was called!");
			break;

		default:
			break;
		}

		if (test.keep_alive) {
			fire_keepalive_timeout(client_socket);
		}

		setUp();
	}

	free_dummy_client(client_socket);
}